

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

void M_Drawer(void)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  
  lVar3 = (long)consoleplayer;
  lVar1 = (&DAT_017e1fb8)[lVar3 * 0x54];
  uVar5 = 0;
  uVar6 = 0;
  if (lVar1 != 0) {
    uVar6 = uVar5;
    if ((*(byte *)(lVar1 + 0x20) & 0x20) == 0) {
      if (screen->Accel2D == false) {
        if ((gamestate == GS_TITLELEVEL) || (gamestate == GS_LEVEL)) {
          puVar4 = &players + lVar3 * 0x54;
          if (*(undefined8 **)(lVar1 + 0x230) != (undefined8 *)0x0) {
            puVar4 = *(undefined8 **)(lVar1 + 0x230);
          }
          uVar6 = (int)(*(float *)(puVar4 + 0x35) * 255.0) & 0xffU |
                  ((int)(*(float *)((long)puVar4 + 0x1a4) * 255.0) & 0xffU) << 8 |
                  ((int)(*(float *)(puVar4 + 0x34) * 255.0) & 0xffU) << 0x10 |
                  (int)(*(float *)((long)puVar4 + 0x1ac) * 255.0) << 0x18;
        }
      }
    }
    else {
      (&DAT_017e1fb8)[lVar3 * 0x54] = 0;
    }
  }
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    iVar2 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xb])();
    if ((char)iVar2 != '\0') {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xd])
                (screen,(ulong)uVar6);
      V_SetBorderNeedRefresh();
    }
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[10])();
    return;
  }
  return;
}

Assistant:

void M_Drawer (void) 
{
	player_t *player = &players[consoleplayer];
	AActor *camera = player->camera;
	PalEntry fade = 0;

	if (!screen->Accel2D && camera != NULL && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
	{
		if (camera->player != NULL)
		{
			player = camera->player;
		}
		fade = PalEntry (BYTE(player->BlendA*255), BYTE(player->BlendR*255), BYTE(player->BlendG*255), BYTE(player->BlendB*255));
	}


	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		if (DMenu::CurrentMenu->DimAllowed())
		{
			screen->Dim(fade);
			V_SetBorderNeedRefresh();
		}
		DMenu::CurrentMenu->Drawer();
	}
}